

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O0

void __thiscall CGV::visit(CGV *this,FuncDef *node)

{
  SymbolTable *this_00;
  CodeWriter *pCVar1;
  bool bVar2;
  ASTNode *pAVar3;
  ASTNode *this_01;
  string *psVar4;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *this_02;
  reference ppAVar5;
  Function *pFVar6;
  allocator local_551;
  string local_550;
  allocator local_529;
  string local_528;
  allocator local_501;
  string local_500;
  allocator local_4d9;
  string local_4d8;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  string local_488;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  undefined1 local_60 [8];
  string returnType;
  string funcName;
  ASTNode *signature;
  FuncDef *node_local;
  CGV *this_local;
  
  pAVar3 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  this_01 = AST::ASTNode::getChild(pAVar3,0);
  psVar4 = AST::ASTNode::getName_abi_cxx11_(this_01);
  std::__cxx11::string::string((string *)(returnType.field_2._M_local_buf + 8),(string *)psVar4);
  this_02 = AST::ASTNode::getChildren(pAVar3);
  ppAVar5 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::back(this_02);
  psVar4 = AST::ASTNode::getName_abi_cxx11_(*ppAVar5);
  std::__cxx11::string::string((string *)local_60,(string *)psVar4);
  this_00 = this->symbolTable;
  pFVar6 = STGV::createTempFunction
                     (&node->super_ASTNode,(string *)((long)&returnType.field_2 + 8),
                      (string *)local_60,(Detector *)0x0);
  pFVar6 = Semantic::SymbolTable::getFreeFunction
                     (this_00,(string *)((long)&returnType.field_2 + 8),pFVar6);
  this->currentFunction = pFVar6;
  pCVar1 = this->writer;
  psVar4 = Function::getTag_abi_cxx11_(this->currentFunction);
  CodeWriter::tag(pCVar1,psVar4,false);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"Saving values of reserved registers",&local_91);
  CodeWriter::comment(pCVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"r12",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"r15",&local_e1);
  CodeWriter::saveWord(pCVar1,-4,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"r12",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"r14",&local_131);
  CodeWriter::saveWord(pCVar1,-8,&local_108,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"r12",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"r12",&local_181);
  CodeWriter::saveWord(pCVar1,-0xc,&local_158,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a8,"Moving stack pointer to the same address as frame pointer",
             &local_1a9);
  CodeWriter::comment(pCVar1,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"subi",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"r14",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"r12",&local_221);
  std::__cxx11::to_string(&local_248,0xc);
  CodeWriter::OP(pCVar1,&local_1d0,&local_1f8,&local_220,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pAVar3 = AST::ASTNode::getChild(&node->super_ASTNode,1);
  (**pAVar3->_vptr_ASTNode)(pAVar3,this);
  pCVar1 = this->writer;
  psVar4 = Function::getTag_abi_cxx11_(this->currentFunction);
  std::operator+(&local_268,psVar4,"_end");
  CodeWriter::tag(pCVar1,&local_268,false);
  std::__cxx11::string::~string((string *)&local_268);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_288,
             "Moving stack pointer back to its position before function definition",&local_289);
  CodeWriter::comment(pCVar1,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"addi",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"r12",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"r14",&local_301);
  std::__cxx11::to_string(&local_328,0xc);
  CodeWriter::OP(pCVar1,&local_2b0,&local_2d8,&local_300,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_348,
             "setting values of reserved registers to their old values before function definition",
             &local_349);
  CodeWriter::comment(pCVar1,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"r15",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"r12",&local_399);
  CodeWriter::loadWord(pCVar1,&local_370,-4,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"r14",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"r12",&local_3e9);
  CodeWriter::loadWord(pCVar1,&local_3c0,-8,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"r12",&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"r12",&local_439);
  CodeWriter::loadWord(pCVar1,&local_410,-0xc,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  psVar4 = Function::getReturnType_abi_cxx11_(this->currentFunction);
  bVar2 = std::operator!=(psVar4,"void");
  if (bVar2) {
    pCVar1 = this->writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_460,"Loading return value to r1",&local_461);
    CodeWriter::comment(pCVar1,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    pCVar1 = this->writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_488,"r1",&local_489);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b0,"r13",&local_4b1);
    CodeWriter::loadWord(pCVar1,&local_488,-4,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    pCVar1 = this->writer;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4d8,"r12",&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_500,"r1",&local_501);
    CodeWriter::saveWord(pCVar1,-4,&local_4d8,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  }
  pCVar1 = this->writer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_528,"jr",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"r15",&local_551);
  CodeWriter::OP(pCVar1,&local_528,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(returnType.field_2._M_local_buf + 8));
  return;
}

Assistant:

void CGV::visit(FuncDef *node) {
    auto signature = node->getChild(0);
    std::string funcName = signature->getChild(0)->getName();
    std::string returnType = signature->getChildren().back()->getName();
    currentFunction = symbolTable->getFreeFunction(funcName, STGV::createTempFunction(node, funcName, returnType, nullptr));
    writer->tag(currentFunction->getTag());
    writer->comment("Saving values of reserved registers");
    writer->saveWord(-4, "r12", "r15");
    writer->saveWord(-8, "r12", "r14");
    writer->saveWord(-12, "r12", "r12");
    writer->comment("Moving stack pointer to the same address as frame pointer");
    writer->OP("subi", "r14", "r12", std::to_string(12));
    //calling `funcBody` node
    node->getChild(1)->accept(*this);
    writer->tag(currentFunction->getTag() + "_end");
    writer->comment("Moving stack pointer back to its position before function definition");
    writer->OP("addi", "r12", "r14", std::to_string(12));
    writer->comment("setting values of reserved registers to their old values before function definition");
    writer->loadWord("r15", -4, "r12");
    writer->loadWord("r14", -8, "r12");
    writer->loadWord("r12", -12, "r12");
    if (currentFunction->getReturnType() != "void") {
        writer->comment("Loading return value to r1");
        writer->loadWord("r1", -4, "r13");
        writer->saveWord(-4, "r12", "r1");
    }
    writer->OP("jr", "r15");
}